

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O3

bool __thiscall
GF2::MI<8UL,_GF2::MOGrevlex<8UL>_>::Reduce
          (MI<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *polyRight)

{
  size_t *psVar1;
  list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> *plVar2;
  _List_node_base **pp_Var3;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *pMVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  _List_node_base *p_Var8;
  list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> *plVar9;
  MM<8UL> lm;
  MP<8UL,_GF2::MOGrevlex<8UL>_> poly;
  Geobucket<2UL> gb;
  WW<8UL> local_90;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *local_88;
  list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> *local_80;
  list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> *local_78;
  long local_70;
  Geobucket<2UL> local_60;
  
  MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::Geobucket(&local_60,polyRight);
  local_88 = polyRight;
  std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::clear
            (&polyRight->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>);
  local_90._words[0] = (word  [1])0;
  bVar6 = false;
  local_70 = 0;
  local_80 = (list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> *)&local_80;
  local_78 = (list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> *)&local_80;
  do {
    bVar5 = MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::PopLM(&local_60,(MM<8UL> *)&local_90);
    p_Var8 = (_List_node_base *)this;
    plVar9 = local_80;
    if (!bVar5) {
      while (plVar9 != (list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> *)&local_80) {
        plVar2 = *(list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> **)plVar9;
        operator_delete(plVar9,0x18);
        plVar9 = plVar2;
      }
      if (local_60._maxsizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60._maxsizes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60._maxsizes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60._maxsizes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
      ::~vector(&local_60._buckets);
      return bVar6;
    }
    do {
      p_Var8 = (((MI<8UL,_GF2::MOGrevlex<8UL>_> *)p_Var8)->
               super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ).
               super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if ((p_Var8 == (_List_node_base *)this) ||
         (iVar7 = MOGrevlex<8UL>::Compare
                            ((MOGrevlex<8UL> *)&this->field_0x18,
                             (MM<8UL> *)(*(long *)(p_Var8 + 1) + 0x10),(MM<8UL> *)&local_90),
         0 < iVar7)) goto LAB_00137068;
      pp_Var3 = &p_Var8[1]._M_next;
    } while ((*(ulong *)((long)*pp_Var3 + 0x10) & ~(ulong)local_90._words[0]) != 0);
    if ((list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> *)pp_Var3 !=
        (list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> *)&local_80) {
      std::__cxx11::list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>>::
      _M_assign_dispatch<std::_List_const_iterator<GF2::MM<8ul>>>
                ((list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> *)&local_80,*pp_Var3,pp_Var3);
    }
    plVar9 = local_80;
    local_70 = local_70 + -1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(plVar9,0x18);
    local_90._words[0] = (word  [1])(~*(ulong *)((long)*pp_Var3 + 0x10) & (ulong)local_90._words[0])
    ;
    for (plVar9 = local_80; plVar9 != (list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> *)&local_80;
        plVar9 = *(list<GF2::MM<8ul>,std::allocator<GF2::MM<8ul>>> **)plVar9) {
      *(ulong *)(plVar9 + 0x10) = *(ulong *)(plVar9 + 0x10) | (ulong)local_90._words[0];
    }
    MP<8UL,_GF2::MOGrevlex<8UL>_>::Normalize((MP<8UL,_GF2::MOGrevlex<8UL>_> *)&local_80);
    MP<8UL,_GF2::MOGrevlex<8UL>_>::Geobucket<2UL>::SymDiffSplice
              (&local_60,(MP<8UL,_GF2::MOGrevlex<8UL>_> *)&local_80);
    bVar6 = true;
    if (p_Var8 == (_List_node_base *)this) {
LAB_00137068:
      p_Var8 = (_List_node_base *)operator_new(0x18);
      pMVar4 = local_88;
      p_Var8[1]._M_next = (_List_node_base *)local_90._words[0];
      std::__detail::_List_node_base::_M_hook(p_Var8);
      psVar1 = &(pMVar4->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
                super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
    }
  } while( true );
}

Assistant:

bool Reduce(MP<_n, _O>& polyRight) const
	{	
		typename MP<_n, _O>::template Geobucket<2> gb(polyRight);
		// будем сохранять в polyRight остаток
		polyRight.SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP<_n, _O> poly(_order);
		while (gb.PopLM(lm))
		{
			// двигаемся от младших многочленов системы к старшим
			const_iterator iterPoly = begin();
			for (; iterPoly != end(); ++iterPoly)
			{
				// прекращаем заведомо нерезультативные итерации
				if (_order.Compare(iterPoly->LM(), lm) > 0)
				{
					iterPoly = end();
					break;
				}
				// делимость старших мономов?
				if (iterPoly->LM() | lm)
				{
					changed = true;
					// готовим множитель
					(poly = *iterPoly).PopLM();
					// перемножаем и добавляем в geobucket
					gb.SymDiffSplice(poly *= (lm /= iterPoly->LM()));
					// все сначала
					break;
				}
			}
			// lm не делится ни на один из старших многочленов системы,
			// поэтому заносим lm в остаток
			if (iterPoly == end()) polyRight.push_back(lm);
		}
		return changed;
	}